

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O1

MeshGL * CubeSTL(void)

{
  vector<float,_std::allocator<float>_> *this;
  int iVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  double dVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  MeshGL *in_RDI;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  mat3 triPos;
  vec3 normal;
  MeshGL cubeIn;
  float local_1e8;
  uint local_1e4 [3];
  double local_1d8;
  long local_1d0;
  int local_1c4 [3];
  double local_1b8 [10];
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  ulong local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  MeshGLP<float,_unsigned_int> local_118;
  
  local_130 = 0x3ff0000000000000;
  uStack_128 = 0x3ff0000000000000;
  local_120 = 0x3ff0000000000000;
  manifold::Manifold::Cube(local_1b8,1);
  manifold::Manifold::GetMeshGL((int)&local_118);
  manifold::Manifold::~Manifold((Manifold *)local_1b8);
  this = &in_RDI->vertProperties;
  memset(this,0,0xdc);
  in_RDI->numProp = 6;
  if ((int)((ulong)((long)local_118.triVerts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_118.triVerts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) / 3) != 0) {
    local_138 = &in_RDI->triVerts;
    uVar10 = 0;
    lVar7 = 0;
    do {
      local_1b8[6] = 0.0;
      local_1b8[7] = 0.0;
      local_1b8[4] = 0.0;
      local_1b8[5] = 0.0;
      local_1b8[2] = 0.0;
      local_1b8[3] = 0.0;
      local_1b8[0] = 0.0;
      local_1b8[1] = 0.0;
      local_1b8[8] = 0.0;
      local_168 = 2.12199579096527e-314;
      local_160 = (double)CONCAT44(local_160._4_4_,2);
      local_1d8 = (double)(uVar10 * 0xc);
      lVar11 = 0;
      local_1d0 = lVar7;
      local_140 = uVar10;
      do {
        lVar7 = local_1d0;
        iVar1 = *(int *)((long)&local_168 + lVar11);
        local_1e4[0] = (uint)local_1d0;
        iVar3._M_current =
             (in_RDI->triVerts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (in_RDI->triVerts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (local_138,iVar3,local_1e4);
        }
        else {
          *iVar3._M_current = (uint)local_1d0;
          (in_RDI->triVerts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        local_1d0 = lVar7 + 1;
        local_1e4[0] = 0;
        local_1e4[1] = 1;
        local_1e4[2] = 2;
        iVar2 = *(int *)((long)local_118.triVerts.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start +
                        (long)iVar1 * 4 + (long)local_1d8);
        lVar7 = 0x30;
        if (iVar1 == 1) {
          lVar7 = 0x18;
        }
        if (iVar1 == 0) {
          lVar7 = 0;
        }
        lVar9 = 0;
        do {
          iVar1 = *(int *)((long)local_1e4 + lVar9);
          lVar8 = 0;
          if (iVar1 != 0) {
            lVar8 = (ulong)(iVar1 != 1) * 8 + 8;
          }
          *(double *)((long)local_1b8 + lVar8 + lVar7) =
               (double)local_118.vertProperties.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar2 * local_118.numProp + iVar1];
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xc);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      dVar12 = (local_1b8[4] - local_1b8[1]) * (local_1b8[8] - local_1b8[2]) -
               (local_1b8[7] - local_1b8[1]) * (local_1b8[5] - local_1b8[2]);
      dVar13 = (local_1b8[5] - local_1b8[2]) * (local_1b8[6] - local_1b8[0]) -
               (local_1b8[8] - local_1b8[2]) * (local_1b8[3] - local_1b8[0]);
      dVar14 = (local_1b8[7] - local_1b8[1]) * (local_1b8[3] - local_1b8[0]) -
               (local_1b8[6] - local_1b8[0]) * (local_1b8[4] - local_1b8[1]);
      dVar5 = dVar14 * dVar14 + dVar13 * dVar13 + dVar12 * dVar12;
      if (dVar5 < 0.0) {
        local_1d8 = dVar13;
        local_150 = dVar12;
        local_148 = dVar14;
        dVar5 = sqrt(dVar5);
        dVar12 = local_150;
        dVar13 = local_1d8;
        dVar14 = local_148;
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      local_168 = dVar12 / dVar5;
      local_160 = dVar13 / dVar5;
      local_158 = dVar14 / dVar5;
      local_1e4[0] = 0;
      local_1e4[1] = 1;
      local_1e4[2] = 2;
      lVar11 = 0;
      do {
        local_1c4[0] = 0;
        local_1c4[1] = 1;
        local_1c4[2] = 2;
        lVar9 = 0x30;
        if (*(int *)((long)local_1e4 + lVar11) == 1) {
          lVar9 = 0x18;
        }
        if (*(int *)((long)local_1e4 + lVar11) == 0) {
          lVar9 = 0;
        }
        lVar8 = 0;
        do {
          lVar7 = 0;
          if (*(int *)((long)local_1c4 + lVar8) != 0) {
            lVar7 = (ulong)(*(int *)((long)local_1c4 + lVar8) != 1) * 8 + 8;
          }
          local_1e8 = (float)*(double *)((long)local_1b8 + lVar7 + lVar9);
          iVar4._M_current =
               (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this,iVar4,&local_1e8);
          }
          else {
            *iVar4._M_current = local_1e8;
            (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          lVar7 = local_1d0;
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0xc);
        local_1c4[0] = 0;
        local_1c4[1] = 1;
        local_1c4[2] = 2;
        lVar9 = 0;
        do {
          lVar8 = 0;
          if (*(int *)((long)local_1c4 + lVar9) != 0) {
            lVar8 = (ulong)(*(int *)((long)local_1c4 + lVar9) != 1) * 8 + 8;
          }
          local_1e8 = (float)*(double *)((long)&local_168 + lVar8);
          iVar4._M_current =
               (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this,iVar4,&local_1e8);
          }
          else {
            *iVar4._M_current = local_1e8;
            (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0xc);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      uVar10 = local_140 + 1;
    } while (uVar10 < ((ulong)((long)local_118.triVerts.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_118.triVerts.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) / 3 &
                      0xffffffff));
  }
  uVar6 = manifold::Manifold::ReserveIDs(1);
  local_1b8[0] = (double)CONCAT44(local_1b8[0]._4_4_,uVar6);
  iVar3._M_current =
       (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&in_RDI->runOriginalID,iVar3,(uint *)local_1b8);
  }
  else {
    *iVar3._M_current = uVar6;
    (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&local_118);
  return in_RDI;
}

Assistant:

MeshGL CubeSTL() {
  const MeshGL cubeIn = Manifold::Cube(vec3(1), true).GetMeshGL();
  MeshGL cube;
  cube.numProp = 6;

  for (size_t tri = 0, vert = 0; tri < cubeIn.NumTri(); tri++) {
    mat3 triPos;
    for (const int i : {0, 1, 2}) {
      cube.triVerts.push_back(vert++);

      for (const int j : {0, 1, 2}) {
        triPos[i][j] =
            cubeIn
                .vertProperties[cubeIn.numProp * cubeIn.triVerts[3 * tri + i] +
                                j];
      }
    }

    const vec3 normal =
        la::normalize(la::cross(triPos[1] - triPos[0], triPos[2] - triPos[0]));
    for (const int i : {0, 1, 2}) {
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(triPos[i][j]);
      }
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(normal[j]);
      }
    }
  }

  cube.runOriginalID.push_back(Manifold::ReserveIDs(1));

  return cube;
}